

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_info.cc
# Opt level: O0

void lf::mesh::utils::PrintInfo(ostream *stream,Entity *e,int output_ctrl)

{
  long *plVar1;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  char *pcVar8;
  MatrixXd *pMVar9;
  undefined4 extraout_var_00;
  reference ppEVar10;
  bool local_3c1;
  Matrix<double,__1,__1,_0,__1,__1> local_370;
  RefEl local_351;
  Matrix<double,__1,__1,_0,__1,__1> local_350;
  ColXpr local_338;
  RefEl local_2f9;
  Entity *pEStack_2f8;
  RefEl sub_ent_refel;
  Entity *sub_ent;
  iterator __end5;
  iterator __begin5;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5;
  int sub_ent_num;
  size_type num_sub_ent;
  dim_t co_dim;
  MatrixXd *ref_el_corners;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  long *local_30;
  Geometry *e_geo_ptr;
  RefEl local_1d;
  dim_t dim_ref_el;
  RefEl e_ref_el;
  Entity *pEStack_18;
  int output_ctrl_local;
  Entity *e_local;
  ostream *stream_local;
  
  dim_ref_el = output_ctrl;
  pEStack_18 = e;
  iVar5 = (*e->_vptr_Entity[4])();
  local_1d.type_ = (RefElType)iVar5;
  e_geo_ptr._4_4_ = lf::base::RefEl::Dimension(&local_1d);
  iVar5 = (*pEStack_18->_vptr_Entity[3])();
  local_30 = (long *)CONCAT44(extraout_var,iVar5);
  if (local_30 == (long *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Missing geometry information!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"e_geo_ptr != nullptr",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x51,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
               ,&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)((long)&ref_el_corners + 7));
    lf::base::AssertionFailed(&local_258,&local_280,0x51,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ref_el_corners + 7));
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    abort();
  }
  poVar7 = std::operator<<(stream,"Entity ");
  poVar7 = lf::base::operator<<(poVar7,&local_1d);
  poVar7 = std::operator<<(poVar7,"/");
  plVar1 = local_30;
  if (local_30 == (long *)0x0) {
    __cxa_bad_typeid();
  }
  pcVar8 = std::type_info::name(*(type_info **)(*plVar1 + -8));
  poVar7 = std::operator<<(poVar7,pcVar8);
  std::operator<<(poVar7,'\n');
  if (10 < (int)dim_ref_el) {
    poVar7 = std::operator<<(stream,"Dimension: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,e_geo_ptr._4_4_);
    std::operator<<(poVar7,'\n');
    pMVar9 = lf::base::RefEl::NodeCoords(&local_1d);
    for (sub_ent_num = e_geo_ptr._4_4_; sub_ent_num != 0; sub_ent_num = sub_ent_num + -1) {
      sVar6 = lf::base::RefEl::NumSubEntities(&local_1d,sub_ent_num);
      poVar7 = std::operator<<(stream,'\n');
      poVar7 = std::operator<<(poVar7,"Codimension ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sub_ent_num);
      poVar7 = std::operator<<(poVar7,": ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar6);
      poVar7 = std::operator<<(poVar7," sub-entities");
      std::operator<<(poVar7,'\n');
      if (0x32 < (int)dim_ref_el) {
        __range5._4_4_ = 0;
        iVar5 = (*pEStack_18->_vptr_Entity[1])(pEStack_18,(ulong)(uint)sub_ent_num);
        __begin5._M_current = (Entity **)CONCAT44(extraout_var_00,iVar5);
        __end5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5
                           );
        sub_ent = (Entity *)
                  std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                            ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                             &__begin5);
        while (bVar2 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end5,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&sub_ent), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppEVar10 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end5);
          pEStack_2f8 = *ppEVar10;
          iVar5 = (*pEStack_2f8->_vptr_Entity[4])();
          local_2f9.type_ = (RefElType)iVar5;
          poVar7 = std::operator<<(stream,"* Subentity ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,__range5._4_4_);
          poVar7 = std::operator<<(poVar7," (");
          poVar7 = lf::base::operator<<(poVar7,&local_2f9);
          poVar7 = std::operator<<(poVar7,")");
          std::operator<<(poVar7,'\n');
          if (0x5a < (int)dim_ref_el) {
            (**(code **)(*local_30 + 0x18))
                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_350,local_30,
                       pMVar9);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                      (&local_338,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_350
                       ,(long)__range5._4_4_);
            poVar7 = Eigen::operator<<(stream,(DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                               *)&local_338);
            std::operator<<(poVar7,'\n');
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_350);
          }
          __range5._4_4_ = __range5._4_4_ + 1;
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end5);
        }
      }
    }
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_1d);
    local_351 = lf::base::RefEl::kPoint();
    RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_351);
    local_3c1 = RVar3 == RVar4 && 0x5a < (int)dim_ref_el;
    if (local_3c1) {
      (**(code **)(*local_30 + 0x18))
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_370,local_30,pMVar9)
      ;
      poVar7 = Eigen::operator<<(stream,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        &local_370);
      std::operator<<(poVar7,'\n');
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_370);
    }
    poVar7 = std::operator<<(stream,"-----------------------");
    std::operator<<(poVar7,'\n');
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &stream, const lf::mesh::Entity &e,
               int output_ctrl) {
  // Topological type of entity
  const lf::base::RefEl e_ref_el = e.RefEl();
  const base::dim_t dim_ref_el = e_ref_el.Dimension();
  // Geometry of entity and coordinates
  const geometry::Geometry *e_geo_ptr = e.Geometry();
  LF_ASSERT_MSG(e_geo_ptr != nullptr, "Missing geometry information!");

  stream << "Entity " << e_ref_el << "/" << typeid(*e_geo_ptr).name() << '\n';

  if (output_ctrl > 10) {
    stream << "Dimension: " << dim_ref_el << '\n';

    const Eigen::MatrixXd &ref_el_corners(e_ref_el.NodeCoords());

    // Loop over codimensions
    for (base::dim_t co_dim = dim_ref_el; co_dim > 0; co_dim--) {
      const base::size_type num_sub_ent = e_ref_el.NumSubEntities(co_dim);
      stream << '\n'
             << "Codimension " << co_dim << ": " << num_sub_ent
             << " sub-entities" << '\n';

      if (output_ctrl > 50) {
        int sub_ent_num = 0;
        // Loop over subentities
        for (const Entity *sub_ent : e.SubEntities(co_dim)) {
          const lf::base::RefEl sub_ent_refel = sub_ent->RefEl();
          stream << "* Subentity " << sub_ent_num << " (" << sub_ent_refel
                 << ")" << '\n';

          if (output_ctrl > 90) {
            // Print coordinates
            stream << e_geo_ptr->Global(ref_el_corners).col(sub_ent_num)
                   << '\n';
          }

          sub_ent_num += 1;

        }  // loop sub-ent
      }  // if output ctrl
    }  // loop codim

    if (e_ref_el == lf::base::RefEl::kPoint() && output_ctrl > 90) {
      stream << e_geo_ptr->Global(ref_el_corners) << '\n';
    }

    stream << "-----------------------" << '\n';

  }  // if
}